

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeNF
          (ChElementHexaANCF_3843 *this,double xi,double eta,double zeta,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  long lVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  void *pvVar19;
  undefined8 *puVar20;
  double *pdVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ChMatrix33<double> J_Cxi;
  VectorN G_C;
  ChMatrix33<double> J_Cxi_Inv;
  VectorN G_A;
  VectorN G_B;
  VectorN Sxi_compact;
  MatrixNx3c Sxi_D;
  Matrix3xN e_bar;
  MatrixNx3 QiCompact;
  Matrix<double,_3,_3,_1,_3,_3> local_e80;
  undefined1 local_e00 [64];
  undefined1 local_dc0 [64];
  undefined1 local_d80 [64];
  undefined1 local_d40 [64];
  Matrix<double,_3,_3,_1,_3,_3> local_cc8;
  undefined1 local_c80 [64];
  undefined1 local_c40 [64];
  undefined1 local_c00 [64];
  undefined1 local_bc0 [64];
  assign_op<double,_double> local_b80 [64];
  undefined1 local_b40 [64];
  undefined1 local_b00 [64];
  undefined1 local_ac0 [64];
  VectorN local_a80;
  undefined1 local_980 [128];
  undefined1 local_900 [64];
  undefined1 local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  Matrix3xN local_680;
  Matrix<double,_32,_3,_1,_32,_3> local_380;
  
  Calc_Sxi_compact(this,&local_a80,xi,eta,zeta);
  dVar12 = (double)(F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_rows;
  if (2 < (long)dVar12) {
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.array
    [1] = (double)(F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.array
    [2] = 1.48219693752374e-323;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.array
    [5] = 0.0;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.array
    [0] = (double)&local_a80;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.array
    [4] = (double)F;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.array
    [7] = dVar12;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,32,3,1,32,3>,Eigen::Product<Eigen::Matrix<double,32,1,0,32,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>,0>,Eigen::internal::assign_op<double,double>>
              (&local_380,
               (Product<Eigen::Matrix<double,_32,_1,_0,_32,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
                *)&local_680,(assign_op<double,_double> *)local_980,(type)0x0);
    if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
        0x60) {
      pdVar21 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      if (pdVar21 != (double *)0x0) {
        free((void *)pdVar21[-1]);
      }
      pvVar19 = malloc(0x340);
      if (pvVar19 == (void *)0x0) {
        pdVar21 = (double *)0x0;
      }
      else {
        *(void **)(((ulong)pvVar19 & 0xffffffffffffffc0) + 0x38) = pvVar19;
        pdVar21 = (double *)(((ulong)pvVar19 & 0xffffffffffffffc0) + 0x40);
      }
      if (pdVar21 == (double *)0x0) {
        puVar20 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar20 = std::ostream::_M_insert<bool>;
        __cxa_throw(puVar20,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           pdVar21;
      (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0x60;
    }
    if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
        0x60) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Map<Eigen::Matrix<double, 96, 1>>, T1 = double, T2 = double]"
                   );
    }
    pdVar21 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar22 = 0xfffffffffffffff8;
    do {
      dVar12 = local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
               m_data.array[uVar22 + 9];
      dVar2 = local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
              m_data.array[uVar22 + 10];
      dVar3 = local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
              m_data.array[uVar22 + 0xb];
      dVar15 = local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
               m_data.array[uVar22 + 0xc];
      dVar16 = local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
               m_data.array[uVar22 + 0xd];
      dVar17 = local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
               m_data.array[uVar22 + 0xe];
      dVar18 = local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
               m_data.array[uVar22 + 0xf];
      pdVar1 = pdVar21 + uVar22 + 8;
      *pdVar1 = local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
                m_data.array[uVar22 + 8];
      pdVar1[1] = dVar12;
      pdVar1[2] = dVar2;
      pdVar1[3] = dVar3;
      pdVar1[4] = dVar15;
      pdVar1[5] = dVar16;
      pdVar1[6] = dVar17;
      pdVar1[7] = dVar18;
      uVar22 = uVar22 + 8;
    } while (uVar22 < 0x58);
    CalcCoordMatrix(this,&local_680);
    Calc_Sxi_D(this,(MatrixNx3c *)local_980,xi,eta,zeta);
    local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
         = 0.0;
    local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
         = 0.0;
    local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
         = 0.0;
    local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
         = 0.0;
    local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
         = 0.0;
    local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
         = 0.0;
    local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
         = 0.0;
    local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
         = 0.0;
    local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
         = 0.0;
    local_c80._0_8_ = (XprTypeNested)0x3ff0000000000000;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,3,0,32,3>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
              (&local_e80,&local_680,(MatrixNx3c *)local_980,(Scalar *)local_c80);
    local_c80._0_8_ = &local_e80;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_cc8,(SrcXprType *)local_c80,local_b80);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_cc8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[0];
    auVar26 = vbroadcastsd_avx512f(auVar4);
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         local_cc8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar27 = vbroadcastsd_avx512f(auVar25);
    auVar28 = vmulpd_avx512f(auVar26,local_980._0_64_);
    auVar29 = vmulpd_avx512f(auVar27,local_880);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_cc8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[6];
    auVar30 = vbroadcastsd_avx512f(auVar5);
    auVar28 = vaddpd_avx512f(auVar28,auVar29);
    auVar29 = vmulpd_avx512f(auVar30,local_780);
    local_c80 = vaddpd_avx512f(auVar28,auVar29);
    auVar28 = vmulpd_avx512f(auVar26,local_980._64_64_);
    auVar29 = vmulpd_avx512f(auVar27,local_840);
    auVar28 = vaddpd_avx512f(auVar28,auVar29);
    auVar29 = vmulpd_avx512f(auVar30,local_740);
    local_c40 = vaddpd_avx512f(auVar28,auVar29);
    auVar28 = vmulpd_avx512f(auVar26,local_900);
    auVar29 = vmulpd_avx512f(auVar27,local_800);
    auVar28 = vaddpd_avx512f(auVar28,auVar29);
    auVar29 = vmulpd_avx512f(auVar30,local_700);
    local_c00 = vaddpd_avx512f(auVar28,auVar29);
    auVar26 = vmulpd_avx512f(auVar26,local_8c0);
    auVar27 = vmulpd_avx512f(auVar27,local_7c0);
    auVar26 = vaddpd_avx512f(auVar26,auVar27);
    auVar27 = vmulpd_avx512f(auVar30,local_6c0);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_cc8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[1];
    auVar28 = vbroadcastsd_avx512f(auVar6);
    local_bc0 = vaddpd_avx512f(auVar26,auVar27);
    auVar26 = vmulpd_avx512f(local_980._0_64_,auVar28);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_cc8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[4];
    auVar27 = vbroadcastsd_avx512f(auVar7);
    auVar29 = vmulpd_avx512f(local_880,auVar27);
    auVar26 = vaddpd_avx512f(auVar26,auVar29);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_cc8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[7];
    auVar29 = vbroadcastsd_avx512f(auVar8);
    auVar30 = vmulpd_avx512f(local_780,auVar29);
    auVar26 = vaddpd_avx512f(auVar26,auVar30);
    local_b80[0] = (assign_op<double,_double>)auVar26[0];
    local_b80[1] = (assign_op<double,_double>)auVar26[1];
    local_b80[2] = (assign_op<double,_double>)auVar26[2];
    local_b80[3] = (assign_op<double,_double>)auVar26[3];
    local_b80[4] = (assign_op<double,_double>)auVar26[4];
    local_b80[5] = (assign_op<double,_double>)auVar26[5];
    local_b80[6] = (assign_op<double,_double>)auVar26[6];
    local_b80[7] = (assign_op<double,_double>)auVar26[7];
    local_b80[8] = (assign_op<double,_double>)auVar26[8];
    local_b80[9] = (assign_op<double,_double>)auVar26[9];
    local_b80[10] = (assign_op<double,_double>)auVar26[10];
    local_b80[0xb] = (assign_op<double,_double>)auVar26[0xb];
    local_b80[0xc] = (assign_op<double,_double>)auVar26[0xc];
    local_b80[0xd] = (assign_op<double,_double>)auVar26[0xd];
    local_b80[0xe] = (assign_op<double,_double>)auVar26[0xe];
    local_b80[0xf] = (assign_op<double,_double>)auVar26[0xf];
    local_b80[0x10] = (assign_op<double,_double>)auVar26[0x10];
    local_b80[0x11] = (assign_op<double,_double>)auVar26[0x11];
    local_b80[0x12] = (assign_op<double,_double>)auVar26[0x12];
    local_b80[0x13] = (assign_op<double,_double>)auVar26[0x13];
    local_b80[0x14] = (assign_op<double,_double>)auVar26[0x14];
    local_b80[0x15] = (assign_op<double,_double>)auVar26[0x15];
    local_b80[0x16] = (assign_op<double,_double>)auVar26[0x16];
    local_b80[0x17] = (assign_op<double,_double>)auVar26[0x17];
    local_b80[0x18] = (assign_op<double,_double>)auVar26[0x18];
    local_b80[0x19] = (assign_op<double,_double>)auVar26[0x19];
    local_b80[0x1a] = (assign_op<double,_double>)auVar26[0x1a];
    local_b80[0x1b] = (assign_op<double,_double>)auVar26[0x1b];
    local_b80[0x1c] = (assign_op<double,_double>)auVar26[0x1c];
    local_b80[0x1d] = (assign_op<double,_double>)auVar26[0x1d];
    local_b80[0x1e] = (assign_op<double,_double>)auVar26[0x1e];
    local_b80[0x1f] = (assign_op<double,_double>)auVar26[0x1f];
    local_b80[0x20] = (assign_op<double,_double>)auVar26[0x20];
    local_b80[0x21] = (assign_op<double,_double>)auVar26[0x21];
    local_b80[0x22] = (assign_op<double,_double>)auVar26[0x22];
    local_b80[0x23] = (assign_op<double,_double>)auVar26[0x23];
    local_b80[0x24] = (assign_op<double,_double>)auVar26[0x24];
    local_b80[0x25] = (assign_op<double,_double>)auVar26[0x25];
    local_b80[0x26] = (assign_op<double,_double>)auVar26[0x26];
    local_b80[0x27] = (assign_op<double,_double>)auVar26[0x27];
    local_b80[0x28] = (assign_op<double,_double>)auVar26[0x28];
    local_b80[0x29] = (assign_op<double,_double>)auVar26[0x29];
    local_b80[0x2a] = (assign_op<double,_double>)auVar26[0x2a];
    local_b80[0x2b] = (assign_op<double,_double>)auVar26[0x2b];
    local_b80[0x2c] = (assign_op<double,_double>)auVar26[0x2c];
    local_b80[0x2d] = (assign_op<double,_double>)auVar26[0x2d];
    local_b80[0x2e] = (assign_op<double,_double>)auVar26[0x2e];
    local_b80[0x2f] = (assign_op<double,_double>)auVar26[0x2f];
    local_b80[0x30] = (assign_op<double,_double>)auVar26[0x30];
    local_b80[0x31] = (assign_op<double,_double>)auVar26[0x31];
    local_b80[0x32] = (assign_op<double,_double>)auVar26[0x32];
    local_b80[0x33] = (assign_op<double,_double>)auVar26[0x33];
    local_b80[0x34] = (assign_op<double,_double>)auVar26[0x34];
    local_b80[0x35] = (assign_op<double,_double>)auVar26[0x35];
    local_b80[0x36] = (assign_op<double,_double>)auVar26[0x36];
    local_b80[0x37] = (assign_op<double,_double>)auVar26[0x37];
    local_b80[0x38] = (assign_op<double,_double>)auVar26[0x38];
    local_b80[0x39] = (assign_op<double,_double>)auVar26[0x39];
    local_b80[0x3a] = (assign_op<double,_double>)auVar26[0x3a];
    local_b80[0x3b] = (assign_op<double,_double>)auVar26[0x3b];
    local_b80[0x3c] = (assign_op<double,_double>)auVar26[0x3c];
    local_b80[0x3d] = (assign_op<double,_double>)auVar26[0x3d];
    local_b80[0x3e] = (assign_op<double,_double>)auVar26[0x3e];
    local_b80[0x3f] = (assign_op<double,_double>)auVar26[0x3f];
    auVar26 = vmulpd_avx512f(local_980._64_64_,auVar28);
    auVar30 = vmulpd_avx512f(local_840,auVar27);
    auVar26 = vaddpd_avx512f(auVar26,auVar30);
    auVar30 = vmulpd_avx512f(local_740,auVar29);
    local_b40 = vaddpd_avx512f(auVar26,auVar30);
    auVar26 = vmulpd_avx512f(local_900,auVar28);
    auVar30 = vmulpd_avx512f(local_800,auVar27);
    auVar26 = vaddpd_avx512f(auVar26,auVar30);
    auVar30 = vmulpd_avx512f(local_700,auVar29);
    local_b00 = vaddpd_avx512f(auVar26,auVar30);
    auVar26 = vmulpd_avx512f(local_8c0,auVar28);
    auVar27 = vmulpd_avx512f(local_7c0,auVar27);
    auVar26 = vaddpd_avx512f(auVar26,auVar27);
    auVar27 = vmulpd_avx512f(local_6c0,auVar29);
    local_ac0 = vaddpd_avx512f(auVar26,auVar27);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_cc8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[2];
    auVar26 = vbroadcastsd_avx512f(auVar9);
    auVar27 = vmulpd_avx512f(local_980._0_64_,auVar26);
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         local_cc8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar28 = vbroadcastsd_avx512f(auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         local_cc8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar29 = vbroadcastsd_avx512f(auVar11);
    auVar30 = vmulpd_avx512f(local_880,auVar28);
    auVar27 = vaddpd_avx512f(auVar27,auVar30);
    auVar30 = vmulpd_avx512f(local_780,auVar29);
    local_e00 = vaddpd_avx512f(auVar27,auVar30);
    auVar27 = vmulpd_avx512f(local_980._64_64_,auVar26);
    auVar30 = vmulpd_avx512f(local_840,auVar28);
    auVar27 = vaddpd_avx512f(auVar27,auVar30);
    auVar30 = vmulpd_avx512f(local_740,auVar29);
    local_dc0 = vaddpd_avx512f(auVar27,auVar30);
    auVar27 = vmulpd_avx512f(local_900,auVar26);
    auVar30 = vmulpd_avx512f(local_800,auVar28);
    auVar27 = vaddpd_avx512f(auVar27,auVar30);
    auVar30 = vmulpd_avx512f(local_700,auVar29);
    local_d80 = vaddpd_avx512f(auVar27,auVar30);
    auVar26 = vmulpd_avx512f(local_8c0,auVar26);
    auVar27 = vmulpd_avx512f(local_7c0,auVar28);
    auVar26 = vaddpd_avx512f(auVar26,auVar27);
    auVar27 = vmulpd_avx512f(local_6c0,auVar29);
    local_d40 = vaddpd_avx512f(auVar26,auVar27);
    if (5 < (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar21 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      auVar14._8_8_ = 0x3fe0000000000000;
      auVar14._0_8_ = 0x3fe0000000000000;
      auVar25 = vmulpd_avx512vl(*(undefined1 (*) [16])(pdVar21 + 3),auVar14);
      dVar12 = pdVar21[5] * 0.5;
      auVar4 = vshufpd_avx(auVar25,auVar25,1);
      pdVar21 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      lVar13 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      ;
      lVar23 = 2;
      lVar24 = 0;
      while (lVar23 + -2 < lVar13) {
        dVar2 = *(double *)(local_e00 + lVar24);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = dVar2;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(double *)(local_b80 + lVar24);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(double *)(local_b80 + lVar24) * -dVar12;
        auVar5 = vfmadd231sd_fma(auVar43,auVar4,auVar40);
        pdVar21[lVar23 + -2] = auVar5._0_8_ + pdVar21[lVar23 + -2];
        if (lVar13 <= lVar23 + -1) break;
        dVar3 = *(double *)(local_c80 + lVar24);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = dVar3;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = dVar12;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = dVar2 * -auVar25._0_8_;
        auVar5 = vfmadd231sd_fma(auVar41,auVar32,auVar44);
        pdVar21[lVar23 + -1] = auVar5._0_8_ + pdVar21[lVar23 + -1];
        if (lVar13 <= lVar23) break;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = dVar3 * -auVar4._0_8_;
        auVar5 = vfmadd213sd_fma(auVar39,auVar25,auVar42);
        pdVar21[lVar23] = auVar5._0_8_ + pdVar21[lVar23];
        lVar23 = lVar23 + 3;
        lVar24 = lVar24 + 8;
        if (lVar23 == 0x62) {
          auVar31._8_8_ = 0;
          auVar31._0_8_ =
               local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[3];
          auVar33._8_8_ = 0;
          auVar33._0_8_ =
               local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[4];
          auVar35._8_8_ = 0;
          auVar35._0_8_ =
               local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[8];
          auVar37._8_8_ = 0;
          auVar37._0_8_ =
               local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[7];
          auVar38._8_8_ = 0;
          auVar38._0_8_ =
               local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[7] *
               local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[5];
          auVar4 = vfmsub231sd_fma(auVar38,auVar33,auVar35);
          auVar36._8_8_ = 0;
          auVar36._0_8_ =
               local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[6] *
               local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[5];
          auVar25 = vfmsub231sd_fma(auVar36,auVar31,auVar35);
          auVar34._8_8_ = 0;
          auVar34._0_8_ =
               local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[6] *
               local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[4];
          auVar5 = vfmsub231sd_fma(auVar34,auVar31,auVar37);
          *detJ = auVar5._0_8_ *
                  local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[2] +
                  (auVar4._0_8_ *
                   local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[0] -
                  auVar25._0_8_ *
                  local_e80.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[1]);
          return;
        }
      }
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementHexaANCF_3843::ComputeNF(
    const double xi,             // parametric coordinate in volume
    const double eta,            // parametric coordinate in volume
    const double zeta,           // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    // Compute the generalized force vector for the applied force component using the compact form of the shape
    // functions.  This requires a reshaping of the calculated matrix to get it into the correct vector order (just a
    // reinterpretation of the data since the matrix is in row-major format)
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);
    MatrixNx3 QiCompact;

    QiCompact = Sxi_compact * F.segment(0, 3).transpose();

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Qi = QiReshaped;

    // Compute the generalized force vector for the applied moment component
    // See: Antonio M Recuero, Javier F Aceituno, Jose L Escalona, and Ahmed A Shabana.
    // A nonlinear approach for modeling rail flexibility using the absolute nodal coordinate
    // formulation. Nonlinear Dynamics, 83(1-2):463-481, 2016.

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    MatrixNx3c Sxi_D;
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_Cxi;
    ChMatrix33<double> J_Cxi_Inv;

    J_Cxi.noalias() = e_bar * Sxi_D;
    J_Cxi_Inv = J_Cxi.inverse();

    // Compute the unique pieces that make up the moment projection matrix "G"
    VectorN G_A = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 0) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 0) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 0);
    VectorN G_B = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 1) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 1) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 1);
    VectorN G_C = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 2) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 2) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 2);

    ChVectorN<double, 3> M_scaled = 0.5 * F.segment(3, 3);

    // Compute G'M without actually forming the complete matrix "G" (since it has a sparsity pattern to it)
    for (unsigned int i = 0; i < NSF; i++) {
        Qi(3 * i) += M_scaled(1) * G_C(i) - M_scaled(2) * G_B(i);
        Qi((3 * i) + 1) += M_scaled(2) * G_A(i) - M_scaled(0) * G_C(i);
        Qi((3 * i) + 2) += M_scaled(0) * G_B(i) - M_scaled(1) * G_A(i);
    }

    // Compute the element Jacobian between the current configuration and the normalized configuration
    // This is different than the element Jacobian between the reference configuration and the normalized
    //  configuration used in the internal force calculations.  For this calculation, this is the ratio between the
    //  actual differential volume and the normalized differential volume.  The determinate of the element Jacobian is
    //  used to calculate this volume ratio for potential use in Gauss-Quadrature or similar numeric integration.
    detJ = J_Cxi.determinant();
}